

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O3

int Tim_ManPoNum(Tim_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (iVar3 = p->vBoxes->nSize, iVar3 == 0)) {
    iVar2 = p->nCos;
  }
  else {
    iVar3 = iVar3 + -1;
    iVar2 = p->nCos;
    iVar1 = Tim_ManBoxInputFirst(p,iVar3);
    iVar3 = Tim_ManBoxInputNum(p,iVar3);
    iVar2 = iVar2 - (iVar3 + iVar1);
  }
  return iVar2;
}

Assistant:

int Tim_ManPoNum( Tim_Man_t * p )
{
    int iLastBoxId;
    if ( Tim_ManBoxNum(p) == 0 )
        return Tim_ManCoNum(p);
    iLastBoxId = Tim_ManBoxNum(p) - 1;
    return Tim_ManCoNum(p) - (Tim_ManBoxInputFirst(p, iLastBoxId) + Tim_ManBoxInputNum(p, iLastBoxId));
}